

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O3

int_t mc64qd_(int_t *ip,int_t *lenl,int_t *lenh,int_t *w,int_t *wlen,double *a,int_t *nval,
             double *val)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  double adStack_90 [7];
  double split [10];
  
  *nval = 0;
  uVar3 = *wlen;
  if (0 < (int)uVar3) {
    lVar8 = 1;
    uVar9 = 0;
    do {
      lVar12 = (long)w[lVar8 + -1];
      iVar4 = lenh[lVar12 + -1];
      if (lenl[lVar12 + -1] < iVar4) {
        iVar5 = ip[lVar12 + -1];
        lVar12 = (long)(lenl[lVar12 + -1] + iVar5);
        do {
          dVar1 = a[lVar12 + -1];
          if (uVar9 == 0) {
            adStack_90[1] = dVar1;
            *nval = 1;
            uVar9 = 1;
          }
          else {
            uVar11 = (ulong)uVar9;
            iVar10 = uVar9 + 2;
            do {
              if ((int)uVar11 < 1) {
                iVar10 = 1;
                break;
              }
              dVar2 = adStack_90[uVar11];
              if ((dVar2 == dVar1) && (!NAN(dVar2) && !NAN(dVar1))) goto LAB_00115dca;
              iVar10 = iVar10 + -1;
              uVar11 = uVar11 - 1;
            } while (dVar2 <= dVar1);
            uVar7 = uVar9;
            if (iVar10 <= (int)uVar9) {
              do {
                adStack_90[(ulong)uVar7 + 1] = adStack_90[(ulong)(uVar7 - 1) + 1];
                bVar6 = iVar10 < (int)uVar7;
                uVar7 = uVar7 - 1;
              } while (bVar6);
            }
            adStack_90[(ulong)(iVar10 - 1) + 1] = dVar1;
            uVar9 = uVar9 + 1;
            *nval = uVar9;
            if (uVar9 == 10) {
              uVar9 = 10;
              goto LAB_00115def;
            }
          }
LAB_00115dca:
          lVar12 = lVar12 + 1;
        } while (lVar12 < iVar4 + iVar5);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != (ulong)uVar3 + 1);
    if (0 < (int)uVar9) {
LAB_00115def:
      *val = adStack_90[(ulong)((uVar9 + 1 >> 1) - 1) + 1];
    }
  }
  return 0;
}

Assistant:

int_t mc64qd_(int_t *ip, int_t *lenl, int_t *lenh, 
	int_t *w, int_t *wlen, double *a, int_t *nval, double *
	val)
{
    /* System generated locals */
    int_t i__1, i__2, i__3;

    /* Local variables */
    int_t j, k, s;
    double ha;
    int_t ii, pos;
    double split[10];


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* This routine searches for at most XX different numerical values */
/* in the columns W(1:WLEN). XX>=2. */
/* Each column J is scanned between IP(J)+LENL(J) and IP(J)+LENH(J)-1 */
/* until XX values are found or all columns have been considered. */
/* On output, NVAL is the number of different values that is found */
/* and SPLIT(1:NVAL) contains the values in decreasing order. */
/* If NVAL > 0, the routine returns VAL = SPLIT((NVAL+1)/2). */

/* Scan columns in W(1:WLEN). For each encountered value, if value not */
/* already present in SPLIT(1:NVAL), insert value such that SPLIT */
/* remains sorted by decreasing value. */
/* The sorting is done by straightforward insertion; therefore the use */
/* of this routine should be avoided for large XX (XX < 20). */
    /* Parameter adjustments */
    --a;
    --w;
    --lenh;
    --lenl;
    --ip;

    /* Function Body */
    *nval = 0;
    i__1 = *wlen;
    for (k = 1; k <= i__1; ++k) {
	j = w[k];
	i__2 = ip[j] + lenh[j] - 1;
	for (ii = ip[j] + lenl[j]; ii <= i__2; ++ii) {
	    ha = a[ii];
	    if (*nval == 0) {
		split[0] = ha;
		*nval = 1;
	    } else {
/* Check presence of HA in SPLIT */
		for (s = *nval; s >= 1; --s) {
		    if (split[s - 1] == ha) {
			goto L15;
		    }
		    if (split[s - 1] > ha) {
			pos = s + 1;
			goto L21;
		    }
/* L20: */
		}
		pos = 1;
/* The insertion */
L21:
		i__3 = pos;
		for (s = *nval; s >= i__3; --s) {
		    split[s] = split[s - 1];
/* L22: */
		}
		split[pos - 1] = ha;
		++(*nval);
	    }
/* Exit loop if XX values are found */
	    if (*nval == 10) {
		goto L11;
	    }
L15:
	    ;
	}
/* L10: */
    }
/* Determine VAL */
L11:
    if (*nval > 0) {
	*val = split[(*nval + 1) / 2 - 1];
    }
    return 0;
}